

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int big2_scanPoundName(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  int iVar4;
  long lVar5;
  
  if (ptr == end) {
    return -1;
  }
  bVar1 = *ptr;
  iVar4 = 0;
  if (bVar1 < 0xdc) {
    if (bVar1 - 0xd8 < 4) {
LAB_004d2c19:
      iVar4 = 0;
      if ((long)end - (long)ptr < 4) {
        return -2;
      }
      goto switchD_004d2d3f_caseD_8;
    }
    if (bVar1 != 0) goto LAB_004d2c9f;
    bVar2 = *(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[1]);
    if (bVar2 < 0x16) {
      if (bVar2 == 5) {
        if ((long)end - (long)ptr < 2) {
          return -2;
        }
        goto switchD_004d2d3f_caseD_8;
      }
      if (bVar2 == 6) {
        if ((long)end - (long)ptr < 3) {
          return -2;
        }
        goto switchD_004d2d3f_caseD_8;
      }
      if (bVar2 != 7) goto switchD_004d2d3f_caseD_8;
      goto LAB_004d2c19;
    }
    if ((bVar2 != 0x16) && (bVar2 != 0x18)) {
      if (bVar2 != 0x1d) goto switchD_004d2d3f_caseD_8;
      goto LAB_004d2c9f;
    }
  }
  else {
    if ((bVar1 - 0xdc < 4) || ((bVar1 == 0xff && (0xfd < (byte)ptr[1]))))
    goto switchD_004d2d3f_caseD_8;
LAB_004d2c9f:
    if ((*(uint *)((long)namingBitmap +
                  (ulong)((byte)ptr[1] >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5))
         >> ((byte)ptr[1] & 0x1f) & 1) == 0) goto switchD_004d2d3f_caseD_8;
  }
  pbVar3 = (byte *)(ptr + 2);
  if (pbVar3 == (byte *)end) {
    return -0x14;
  }
  lVar5 = (long)end - (long)ptr;
  while( true ) {
    lVar5 = lVar5 + -2;
    bVar1 = *pbVar3;
    ptr = (char *)pbVar3;
    if (bVar1 < 0xdc) break;
    if (bVar1 == 0xff) {
      if (0xfd < pbVar3[1]) goto switchD_004d2d3f_caseD_8;
    }
    else if (bVar1 - 0xdc < 4) goto switchD_004d2d3f_caseD_8;
switchD_004d2d3f_caseD_1d:
    if ((*(uint *)((long)namingBitmap +
                  (ulong)(pbVar3[1] >> 3 & 0x1c | (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5))
         >> (pbVar3[1] & 0x1f) & 1) == 0) goto switchD_004d2d3f_caseD_8;
switchD_004d2d3f_caseD_16:
    pbVar3 = pbVar3 + 2;
    if (pbVar3 == (byte *)end) {
      return -0x14;
    }
  }
  if (bVar1 == 0) {
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)pbVar3[1])) {
    case 5:
      if (lVar5 < 2) {
        return -2;
      }
      goto switchD_004d2d3f_caseD_8;
    case 6:
      if (lVar5 < 3) {
        return -2;
      }
      goto switchD_004d2d3f_caseD_8;
    case 7:
      goto switchD_004d2d3f_caseD_7;
    default:
      goto switchD_004d2d3f_caseD_8;
    case 9:
    case 10:
    case 0xb:
    case 0x15:
    case 0x1e:
    case 0x20:
    case 0x24:
      iVar4 = 0x14;
      goto switchD_004d2d3f_caseD_8;
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      goto switchD_004d2d3f_caseD_16;
    case 0x1d:
      goto switchD_004d2d3f_caseD_1d;
    }
  }
  if (3 < bVar1 - 0xd8) goto switchD_004d2d3f_caseD_1d;
switchD_004d2d3f_caseD_7:
  if (lVar5 < 4) {
    return -2;
  }
switchD_004d2d3f_caseD_8:
  *nextTokPtr = ptr;
  return iVar4;
}

Assistant:

static
int PREFIX(scanPoundName)(const ENCODING *enc, const char *ptr, const char *end,
                          const char **nextTokPtr)
{
  if (ptr == end)
    return XML_TOK_PARTIAL;
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_CR: case BT_LF: case BT_S:
    case BT_RPAR: case BT_GT: case BT_PERCNT: case BT_VERBAR:
      *nextTokPtr = ptr;
      return XML_TOK_POUND_NAME;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return -XML_TOK_POUND_NAME;
}